

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void printPt(ostream *out,ANNpoint p,int dim)

{
  long lVar1;
  
  std::operator<<(out,"(");
  std::ostream::_M_insert<double>(*p);
  for (lVar1 = 1; lVar1 < dim; lVar1 = lVar1 + 1) {
    std::operator<<(out,", ");
    std::ostream::_M_insert<double>(p[lVar1]);
  }
  std::operator<<(out,")\n");
  return;
}

Assistant:

void printPt(ostream &out, ANNpoint p, int dim)  // print point
{
    out << "(" << p[0];
    for (int i = 1; i < dim; i++) {
        out << ", " << p[i];
    }
    out << ")\n";
}